

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cc
# Opt level: O0

fdb_status fdb_begin_transaction(fdb_file_handle *fhandle,fdb_isolation_level_t isolation_level)

{
  bool bVar1;
  file_status_t fVar2;
  file_status_t fVar3;
  plock_ops *ppVar4;
  wal_txn_wrapper *pwVar5;
  _func_void_void_ptr *p_Var6;
  list *plVar7;
  fdb_isolation_level_t in_SIL;
  long *in_RDI;
  filemgr *file;
  fdb_kvs_handle *handle;
  file_status_t fstatus;
  fdb_kvs_handle *in_stack_00000088;
  filemgr *in_stack_ffffffffffffffd8;
  undefined2 uVar8;
  filemgr *file_00;
  undefined6 in_stack_ffffffffffffffe8;
  fdb_status local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    file_00 = (filemgr *)*in_RDI;
    if ((file_00->plock).ops == (plock_ops *)0x0) {
      if (((kvs_info *)(file_00->pos).super___atomic_base<unsigned_long>._M_i == (kvs_info *)0x0) ||
         (((kvs_info *)(file_00->pos).super___atomic_base<unsigned_long>._M_i)->type != '\x01')) {
        bVar1 = atomic_cas_uint8_t((atomic<unsigned_char> *)file_00,
                                   (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38),
                                   (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30));
        if (bVar1) {
          do {
            uVar8 = (undefined2)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
            fdb_check_file_reopen((fdb_kvs_handle *)file_00,(file_status_t *)0x0);
            filemgr_mutex_lock((filemgr *)0x174c6c);
            fdb_sync_db_header(in_stack_00000088);
            bVar1 = filemgr_is_rollback_on(file_00);
            if (bVar1) {
              filemgr_mutex_unlock((filemgr *)0x174c98);
              atomic_cas_uint8_t((atomic<unsigned_char> *)file_00,(uint8_t)((ushort)uVar8 >> 8),
                                 (uint8_t)uVar8);
              return FDB_RESULT_FAIL_BY_ROLLBACK;
            }
            in_stack_ffffffffffffffd8 = (filemgr *)file_00->wal;
            fVar2 = filemgr_get_file_status((filemgr *)0x174cd3);
            if (fVar2 == '\x04') {
              filemgr_mutex_unlock((filemgr *)0x174cea);
            }
          } while (fVar2 == '\x04');
          ppVar4 = (plock_ops *)malloc(0x38);
          (file_00->plock).ops = ppVar4;
          pwVar5 = (wal_txn_wrapper *)malloc(0x18);
          ((file_00->plock).ops)->unlock_internal = (_func_void_void_ptr *)pwVar5;
          ((wal_txn_wrapper *)((file_00->plock).ops)->unlock_internal)->field_1 =
               (anon_union_8_2_f776cba5_for_wal_txn_wrapper_1)(file_00->plock).ops;
          ((file_00->plock).ops)->init_user = (_func_void_void_ptr *)file_00;
          p_Var6 = (_func_void_void_ptr *)
                   std::__atomic_base<unsigned_long>::operator++
                             (&transaction_id.super___atomic_base<unsigned_long>);
          ((file_00->plock).ops)->lock_user = p_Var6;
          fVar3 = filemgr_get_file_status((filemgr *)0x174d91);
          if (fVar3 == '\x01') {
            ((file_00->plock).ops)->unlock_user = (_func_void_void_ptr *)0xffffffffffffffff;
          }
          else {
            p_Var6 = (_func_void_void_ptr *)
                     std::__atomic_base::operator_cast_to_unsigned_long
                               ((__atomic_base<unsigned_long> *)
                                CONCAT17(in_SIL,CONCAT16(fVar2,in_stack_ffffffffffffffe8)));
            ((file_00->plock).ops)->unlock_user = p_Var6;
          }
          p_Var6 = (_func_void_void_ptr *)
                   std::__atomic_base::operator_cast_to_unsigned_long
                             ((__atomic_base<unsigned_long> *)
                              CONCAT17(in_SIL,CONCAT16(fVar2,in_stack_ffffffffffffffe8)));
          ((file_00->plock).ops)->destroy_user = p_Var6;
          plVar7 = (list *)malloc(0x10);
          ((file_00->plock).ops)->init_internal = (_func_void_void_ptr *)plVar7;
          *(fdb_isolation_level_t *)&((file_00->plock).ops)->lock_internal = in_SIL;
          list_init((list *)((file_00->plock).ops)->init_internal);
          wal_add_transaction(file_00,(fdb_txn *)in_stack_ffffffffffffffd8);
          uVar8 = (undefined2)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
          filemgr_mutex_unlock((filemgr *)0x174e5a);
          atomic_cas_uint8_t((atomic<unsigned_char> *)file_00,(uint8_t)((ushort)uVar8 >> 8),
                             (uint8_t)uVar8);
          local_4 = FDB_RESULT_SUCCESS;
        }
        else {
          local_4 = FDB_RESULT_HANDLE_BUSY;
        }
      }
      else {
        local_4 = FDB_RESULT_INVALID_HANDLE;
      }
    }
    else {
      local_4 = FDB_RESULT_TRANSACTION_FAIL;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_begin_transaction(fdb_file_handle *fhandle,
                                 fdb_isolation_level_t isolation_level)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    file_status_t fstatus;
    fdb_kvs_handle *handle = fhandle->root;
    struct filemgr *file;

    if (handle->txn) {
        // transaction already exists
        return FDB_RESULT_TRANSACTION_FAIL;
    }
    if (handle->kvs) {
        if (handle->kvs->type == KVS_SUB) {
            // deny transaction on sub handle
            return FDB_RESULT_INVALID_HANDLE;
        }
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    do { // repeat until file status is not REMOVED_PENDING
        fdb_check_file_reopen(handle, NULL);
        filemgr_mutex_lock(handle->file);
        fdb_sync_db_header(handle);

        if (filemgr_is_rollback_on(handle->file)) {
            // deny beginning transaction during rollback
            filemgr_mutex_unlock(handle->file);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_FAIL_BY_ROLLBACK;
        }

        file = handle->file;
        fstatus = filemgr_get_file_status(file);
        if (fstatus == FILE_REMOVED_PENDING) {
            // we must not create transaction on this file
            // file status was changed by other thread .. start over
            filemgr_mutex_unlock(file);
        }
    } while (fstatus == FILE_REMOVED_PENDING);

    handle->txn = (fdb_txn*)malloc(sizeof(fdb_txn));
    handle->txn->wrapper = (struct wal_txn_wrapper *)
                           malloc(sizeof(struct wal_txn_wrapper));
    handle->txn->wrapper->txn = handle->txn;
    handle->txn->handle = handle;
    handle->txn->txn_id = ++transaction_id;

    if (filemgr_get_file_status(handle->file) != FILE_COMPACT_OLD) {
        // keep previous header's BID
        handle->txn->prev_hdr_bid = handle->last_hdr_bid;
    } else {
        // if file status is COMPACT_OLD,
        // then this transaction will work on new file, and
        // there is no previous header until the compaction is done.
        handle->txn->prev_hdr_bid = BLK_NOT_FOUND;
    }
    handle->txn->prev_revnum = handle->cur_header_revnum;
    handle->txn->items = (struct list *)malloc(sizeof(struct list));
    handle->txn->isolation = isolation_level;
    list_init(handle->txn->items);
    wal_add_transaction(file, handle->txn);

    filemgr_mutex_unlock(file);

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}